

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O0

void Acec_ManProfile(Gia_Man_t *p,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vAdds_00;
  abctime aVar5;
  Vec_Int_t *pVVar6;
  char *pcVar7;
  Vec_Int_t *vAdds;
  Vec_Int_t *vXors;
  Vec_Wec_t *pVStack_28;
  int i;
  Vec_Wec_t *vBoxes;
  abctime clk;
  Gia_Man_t *pGStack_10;
  int fVerbose_local;
  Gia_Man_t *p_local;
  
  clk._4_4_ = fVerbose;
  pGStack_10 = p;
  vBoxes = (Vec_Wec_t *)Abc_Clock();
  vAdds_00 = Ree_ManComputeCuts(pGStack_10,&vAdds,clk._4_4_);
  uVar1 = Ree_ManCountFadds(vAdds_00);
  iVar2 = Vec_IntSize(vAdds_00);
  iVar3 = Ree_ManCountFadds(vAdds_00);
  iVar4 = Vec_IntSize(vAdds);
  printf("Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ",(ulong)uVar1,
         (ulong)(uint)(iVar2 / 6 - iVar3),(long)iVar4 / 4 & 0xffffffff);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - (long)vBoxes);
  vBoxes = (Vec_Wec_t *)Abc_Clock();
  pVStack_28 = Acec_ManCollectBoxSets(pGStack_10,vAdds_00,vAdds);
  iVar2 = Vec_WecSize(pVStack_28);
  iVar3 = Vec_WecSize(pVStack_28);
  pcVar7 = "";
  if (1 < iVar3 / 5) {
    pcVar7 = "s";
  }
  printf("Detected %d adder-tree%s.  ",(ulong)(uint)(iVar2 / 5),pcVar7);
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - (long)vBoxes);
  if (clk._4_4_ != 0) {
    for (vXors._4_4_ = 0; iVar2 = vXors._4_4_ * 5, iVar3 = Vec_WecSize(pVStack_28), iVar2 < iVar3;
        vXors._4_4_ = vXors._4_4_ + 1) {
      printf("Tree %3d : ",(ulong)vXors._4_4_);
      pVVar6 = Vec_WecEntry(pVStack_28,vXors._4_4_ * 5);
      uVar1 = Vec_IntSize(pVVar6);
      printf("Xor = %4d  ",(ulong)uVar1);
      pVVar6 = Vec_WecEntry(pVStack_28,vXors._4_4_ * 5 + 1);
      uVar1 = Vec_IntSize(pVVar6);
      printf("Root = %4d  ",(ulong)uVar1);
      pVVar6 = Vec_WecEntry(pVStack_28,vXors._4_4_ * 5 + 2);
      uVar1 = Vec_IntSize(pVVar6);
      printf("Adder = %4d  ",(ulong)uVar1);
      pVVar6 = Vec_WecEntry(pVStack_28,vXors._4_4_ * 5 + 3);
      iVar2 = Vec_IntSize(pVVar6);
      printf("In = %4d  ",(long)iVar2 / 2 & 0xffffffff,(long)iVar2 % 2 & 0xffffffff);
      pVVar6 = Vec_WecEntry(pVStack_28,vXors._4_4_ * 5 + 4);
      iVar2 = Vec_IntSize(pVVar6);
      printf("Out = %4d  ",(long)iVar2 / 2 & 0xffffffff,(long)iVar2 % 2 & 0xffffffff);
      printf("\n");
      printf("           Ins:  ");
      pVVar6 = Vec_WecEntry(pVStack_28,vXors._4_4_ * 5 + 3);
      Acec_ManPrintRanks(pVVar6);
      printf("           Outs: ");
      pVVar6 = Vec_WecEntry(pVStack_28,vXors._4_4_ * 5 + 4);
      Acec_ManPrintRanks(pVVar6);
    }
  }
  Vec_IntFree(vAdds);
  Vec_IntFree(vAdds_00);
  Vec_WecFree(pVStack_28);
  return;
}

Assistant:

void Acec_ManProfile( Gia_Man_t * p, int fVerbose )
{
    abctime clk = Abc_Clock();
    Vec_Wec_t * vBoxes; int i;
    Vec_Int_t * vXors, * vAdds = Ree_ManComputeCuts( p, &vXors, fVerbose );

    //Ree_ManPrintAdders( vAdds, 1 );
    printf( "Detected %d full-adders and %d half-adders.  Found %d XOR-cuts.  ", Ree_ManCountFadds(vAdds), Vec_IntSize(vAdds)/6-Ree_ManCountFadds(vAdds), Vec_IntSize(vXors)/4 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vBoxes = Acec_ManCollectBoxSets( p, vAdds, vXors );
    printf( "Detected %d adder-tree%s.  ", Vec_WecSize(vBoxes)/5, Vec_WecSize(vBoxes)/5 > 1 ? "s":"" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    if ( fVerbose )
    for ( i = 0; 5*i < Vec_WecSize(vBoxes); i++ )
    {
        printf( "Tree %3d : ",     i );
        printf( "Xor = %4d  ",     Vec_IntSize(Vec_WecEntry(vBoxes,5*i+0)) );
        printf( "Root = %4d  ",    Vec_IntSize(Vec_WecEntry(vBoxes,5*i+1)) );
        //printf( "(Top = %5d)  ",   Vec_IntEntryLast(Vec_WecEntry(vBoxes,5*i+1)) );
        printf( "Adder = %4d  ",   Vec_IntSize(Vec_WecEntry(vBoxes,5*i+2)) );
        printf( "In = %4d  ",      Vec_IntSize(Vec_WecEntry(vBoxes,5*i+3))/2 );
        printf( "Out = %4d  ",     Vec_IntSize(Vec_WecEntry(vBoxes,5*i+4))/2 );
        printf( "\n" );
        printf( "           Ins:  " );
        Acec_ManPrintRanks( Vec_WecEntry(vBoxes,5*i+3) );
        printf( "           Outs: " );
        Acec_ManPrintRanks( Vec_WecEntry(vBoxes,5*i+4) );
    }

    Vec_IntFree( vXors );
    Vec_IntFree( vAdds );
    Vec_WecFree( vBoxes );
}